

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalCSE.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_236::Checker::visitExpression(Checker *this,Expression *curr)

{
  Index IVar1;
  PassOptions *pPVar2;
  size_t curr_00;
  bool bVar3;
  size_type sVar4;
  Module *pMVar5;
  reference ppEVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  pointer ppVar9;
  pointer ppVar10;
  ActiveOriginalInfo *pAVar11;
  pair<std::__detail::_Node_iterator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false,_false>,_bool>
  pVar12;
  ActiveOriginalInfo *originalInfo_1;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>
  local_528;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>
  local_520;
  iterator originalIter;
  ActiveOriginalInfo local_508;
  uint32_t local_38c;
  undefined1 local_388 [8];
  EffectAnalyzer effects_1;
  RequestInfo *info;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
  local_208;
  iterator iter;
  Expression *original_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *__range3_1;
  ActiveOriginalInfo *originalInfo;
  Expression *original;
  pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo> *kv;
  iterator __end3;
  iterator __begin3;
  unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>_>
  *__range3;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> invalidated;
  undefined1 local_188 [8];
  EffectAnalyzer effects;
  Expression *curr_local;
  Checker *this_local;
  
  effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)curr;
  sVar4 = std::
          unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>_>
          ::count(&this->activeOriginals,
                  (key_type *)
                  &effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (sVar4 != 0) {
    __assert_fail("!activeOriginals.count(curr)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/LocalCSE.cpp"
                  ,0x178,"void wasm::(anonymous namespace)::Checker::visitExpression(Expression *)")
    ;
  }
  bVar3 = std::
          unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>_>
          ::empty(&this->activeOriginals);
  if (!bVar3) {
    pPVar2 = this->options;
    pMVar5 = Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
             ::getModule((Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                          *)this);
    EffectAnalyzer::EffectAnalyzer((EffectAnalyzer *)local_188,pPVar2,pMVar5);
    EffectAnalyzer::visit
              ((EffectAnalyzer *)local_188,
               (Expression *)
               effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range3);
    __end3 = std::
             unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>_>
             ::begin(&this->activeOriginals);
    kv = (pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo> *)
         std::
         unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>_>
         ::end(&this->activeOriginals);
    while (bVar3 = std::__detail::operator!=
                             (&__end3.
                               super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>
                              ,(_Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>
                                *)&kv), bVar3) {
      original = (Expression *)
                 std::__detail::
                 _Node_iterator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false,_false>
                 ::operator*(&__end3);
      originalInfo = (ActiveOriginalInfo *)((reference)original)->first;
      bVar3 = EffectAnalyzer::invalidates
                        ((EffectAnalyzer *)local_188,&(((reference)original)->second).effects);
      if (bVar3) {
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range3,
                   (value_type *)&originalInfo);
      }
      std::__detail::
      _Node_iterator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false,_false>
      ::operator++(&__end3);
    }
    __end3_1 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::begin
                         ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                          &__range3);
    original_1 = (Expression *)
                 std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::end
                           ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                            &__range3);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                               *)&original_1), bVar3) {
      ppEVar6 = __gnu_cxx::
                __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                ::operator*(&__end3_1);
      iter.
      super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
      ._M_cur = (_Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                 )*ppEVar6;
      pmVar7 = std::
               unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>_>
               ::at(&this->activeOriginals,(key_type *)&iter);
      IVar1 = pmVar7->requestsLeft;
      pmVar8 = std::
               unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
               ::operator[](&this->requestInfos->
                             super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                            ,(key_type *)&iter);
      pmVar8->requests = pmVar8->requests - IVar1;
      pmVar8 = std::
               unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
               ::operator[](&this->requestInfos->
                             super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                            ,(key_type *)&iter);
      if (pmVar8->requests == 0) {
        std::
        unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
        ::erase(&this->requestInfos->
                 super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                ,(key_type *)&iter);
      }
      std::
      unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>_>
      ::erase(&this->activeOriginals,(key_type *)&iter);
      __gnu_cxx::
      __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
      ::operator++(&__end3_1);
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range3);
    EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_188);
  }
  local_208._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
       ::find(&this->requestInfos->
               super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
              ,(key_type *)&effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
             );
  info = (RequestInfo *)
         std::
         unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
         ::end(&this->requestInfos->
                super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
              );
  bVar3 = std::__detail::operator==
                    (&local_208,
                     (_Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                      *)&info);
  if (bVar3) {
    return;
  }
  ppVar9 = std::__detail::
           _Node_iterator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false,_false>
           ::operator->((_Node_iterator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false,_false>
                         *)&local_208);
  effects_1.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&ppVar9->second;
  RequestInfo::validate
            ((RequestInfo *)
             effects_1.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (*(int *)effects_1.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    if (*(long *)(effects_1.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count + 8) ==
        0) {
      return;
    }
    local_520._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>_>
         ::find(&this->activeOriginals,
                (key_type *)
                (effects_1.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count + 8));
    local_528._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>_>
         ::end(&this->activeOriginals);
    bVar3 = std::__detail::operator==(&local_520,&local_528);
    if (!bVar3) {
      ppVar10 = std::__detail::
                _Node_iterator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false,_false>
                ::operator->((_Node_iterator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false,_false>
                              *)&local_520);
      pAVar11 = &ppVar10->second;
      if (pAVar11->requestsLeft == 1) {
        std::
        unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>_>
        ::erase(&this->activeOriginals,
                (key_type *)
                (effects_1.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count + 8));
        return;
      }
      pAVar11->requestsLeft = pAVar11->requestsLeft - 1;
      return;
    }
    std::
    unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
    ::erase(&this->requestInfos->
             super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
            ,(iterator)local_208._M_cur);
    return;
  }
  pPVar2 = this->options;
  pMVar5 = Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
           ::getModule((Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                        *)this);
  EffectAnalyzer::EffectAnalyzer
            ((EffectAnalyzer *)local_388,pPVar2,pMVar5,
             (Expression *)effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  effects_1.readsMemory = false;
  bVar3 = EffectAnalyzer::hasSideEffects((EffectAnalyzer *)local_388);
  curr_00 = effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (!bVar3) {
    pMVar5 = Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
             ::getModule((Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                          *)this);
    local_38c = (pMVar5->features).features;
    bVar3 = Properties::isGenerative((Expression *)curr_00,(FeatureSet)local_38c);
    if (!bVar3) {
      local_508.requestsLeft =
           *(Index *)effects_1.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
      EffectAnalyzer::EffectAnalyzer(&local_508.effects,(EffectAnalyzer *)local_388);
      pVar12 = std::
               unordered_map<wasm::Expression*,wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>>>
               ::
               emplace<wasm::Expression*&,wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>
                         ((unordered_map<wasm::Expression*,wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>>>
                           *)&this->activeOriginals,
                          (Expression **)
                          &effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          &local_508);
      originalIter.
      super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>
      ._M_cur = (_Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>
                 )pVar12.first.
                  super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>
                  ._M_cur;
      ActiveOriginalInfo::~ActiveOriginalInfo(&local_508);
      goto LAB_017ccb7e;
    }
  }
  std::
  unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ::erase(&this->requestInfos->
           super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
          ,(key_type *)&effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
LAB_017ccb7e:
  EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_388);
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    // This is the first time we encounter this expression.
    assert(!activeOriginals.count(curr));

    // Given the current expression, see what it invalidates of the currently-
    // hashed expressions, if there are any.
    if (!activeOriginals.empty()) {
      EffectAnalyzer effects(options, *getModule());
      // We only need to visit this node itself, as we have already visited its
      // children by the time we get here.
      effects.visit(curr);

      std::vector<Expression*> invalidated;
      for (auto& kv : activeOriginals) {
        auto* original = kv.first;
        auto& originalInfo = kv.second;
        if (effects.invalidates(originalInfo.effects)) {
          invalidated.push_back(original);
        }
      }

      for (auto* original : invalidated) {
        // Remove all requests after this expression, as we cannot optimize to
        // them.
        requestInfos[original].requests -=
          activeOriginals.at(original).requestsLeft;

        // If no requests remain at all (that is, there were no requests we
        // could provide before we ran into this invalidation) then we do not
        // need this original at all.
        if (requestInfos[original].requests == 0) {
          requestInfos.erase(original);
        }

        activeOriginals.erase(original);
      }
    }

    auto iter = requestInfos.find(curr);
    if (iter == requestInfos.end()) {
      return;
    }
    auto& info = iter->second;
    info.validate();

    if (info.requests > 0) {
      // This is an original. Compute its side effects, as we cannot optimize
      // away repeated apperances if it has any.
      EffectAnalyzer effects(options, *getModule(), curr);

      // We can ignore traps here, as we replace a repeating expression with a
      // single appearance of it, a store to a local, and gets in the other
      // locations, and so if the expression traps then the first appearance -
      // that we keep around - would trap, and the others are never reached
      // anyhow. (The other checks we perform here, including invalidation and
      // determinism, will ensure that either all of the appearances trap, or
      // none of them.)
      effects.trap = false;

      // We also cannot optimize away something that is intrinsically
      // nondeterministic: even if it has no side effects, if it may return a
      // different result each time, then we cannot optimize away repeats.
      if (effects.hasSideEffects() ||
          Properties::isGenerative(curr, getModule()->features)) {
        requestInfos.erase(curr);
      } else {
        activeOriginals.emplace(
          curr, ActiveOriginalInfo{info.requests, std::move(effects)});
      }
    } else if (info.original) {
      // The original may have already been invalidated. If so, remove our info
      // as well.
      auto originalIter = activeOriginals.find(info.original);
      if (originalIter == activeOriginals.end()) {
        requestInfos.erase(iter);
        return;
      }

      // After visiting this expression, we have one less request for its
      // original, and perhaps none are left.
      auto& originalInfo = originalIter->second;
      if (originalInfo.requestsLeft == 1) {
        activeOriginals.erase(info.original);
      } else {
        originalInfo.requestsLeft--;
      }
    }
  }